

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O3

void anon_unknown.dwarf_38441::replaceAll(string *s,string *search,string *replace)

{
  ulong uVar1;
  
  for (uVar1 = std::__cxx11::string::find((char *)s,(ulong)(search->_M_dataplus)._M_p,0);
      uVar1 != 0xffffffffffffffff;
      uVar1 = std::__cxx11::string::find
                        ((char *)s,(ulong)(search->_M_dataplus)._M_p,
                         uVar1 + replace->_M_string_length)) {
    std::__cxx11::string::erase((ulong)s,uVar1);
    std::__cxx11::string::replace((ulong)s,uVar1,(char *)0x0,(ulong)(replace->_M_dataplus)._M_p);
  }
  return;
}

Assistant:

void replaceAll(std::string & s, const std::string & search, const std::string & replace) {
        for (size_t pos = 0; ; pos += replace.length()) {
            pos = s.find(search, pos);
            if (pos == std::string::npos) break;
            s.erase(pos, search.length());
            s.insert(pos, replace);
        }
    }